

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O0

bool __thiscall Catch::TestSpec::TagPattern::matches(TagPattern *this,TestCaseInfo *testCase)

{
  bool bVar1;
  __normal_iterator<const_Catch::Tag_*,_std::vector<Catch::Tag,_std::allocator<Catch::Tag>_>_>
  local_58;
  StringRef local_50;
  Tag local_40;
  __normal_iterator<const_Catch::Tag_*,_std::vector<Catch::Tag,_std::allocator<Catch::Tag>_>_>
  local_30;
  __normal_iterator<const_Catch::Tag_*,_std::vector<Catch::Tag,_std::allocator<Catch::Tag>_>_>
  local_28;
  __normal_iterator<const_Catch::Tag_*,_std::vector<Catch::Tag,_std::allocator<Catch::Tag>_>_>
  local_20;
  TestCaseInfo *local_18;
  TestCaseInfo *testCase_local;
  TagPattern *this_local;
  
  local_18 = testCase;
  testCase_local = (TestCaseInfo *)this;
  local_28._M_current =
       (Tag *)std::begin<std::vector<Catch::Tag,std::allocator<Catch::Tag>>>(&testCase->tags);
  local_30._M_current =
       (Tag *)std::end<std::vector<Catch::Tag,std::allocator<Catch::Tag>>>(&local_18->tags);
  StringRef::StringRef(&local_50,&this->m_tag);
  Tag::Tag(&local_40,local_50);
  local_20 = std::
             find<__gnu_cxx::__normal_iterator<Catch::Tag_const*,std::vector<Catch::Tag,std::allocator<Catch::Tag>>>,Catch::Tag>
                       (local_28,local_30,&local_40);
  local_58._M_current =
       (Tag *)std::end<std::vector<Catch::Tag,std::allocator<Catch::Tag>>>(&local_18->tags);
  bVar1 = __gnu_cxx::operator!=(&local_20,&local_58);
  return bVar1;
}

Assistant:

bool TestSpec::TagPattern::matches( TestCaseInfo const& testCase ) const {
        return std::find( begin( testCase.tags ),
                          end( testCase.tags ),
                          Tag( m_tag ) ) != end( testCase.tags );
    }